

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall
asl::String::replace(String *__return_storage_ptr__,String *this,String *a,String *b)

{
  int iVar1;
  int j;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  int i0;
  long lVar4;
  String local_48;
  
  j = indexOf(this,a,0);
  if (j == -1) {
    String(__return_storage_ptr__,this);
  }
  else {
    iVar1 = a->_len;
    String(__return_storage_ptr__,this->_len,0);
    substring(&local_48,this,0,j);
    operator+=(__return_storage_ptr__,&local_48);
    ~String(&local_48);
    while( true ) {
      lVar4 = (long)j + (long)iVar1;
      i0 = (int)lVar4;
      if (this->_len < i0) break;
      iVar2 = indexOf(this,a,i0);
      j = this->_len;
      operator+=(__return_storage_ptr__,b);
      if (iVar2 != -1) {
        j = iVar2;
      }
      paVar3 = &this->field_2;
      if (this->_size != 0) {
        paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
      }
      append(__return_storage_ptr__,paVar3->_space + lVar4,j - i0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::replace(const String& a, const String& b) const
{
	int j = indexOf(a), m = a.length();
	if(j==-1)
		return *this;
	String out(length(), 0);
	out << substring(0, j);
	for(int i=j+m; i<=length(); i=j+m)
	{
		j = indexOf(a, i);
		if(j==-1) j=length();
		out << b;
		out.append(str() + i, j - i);
	}
	return out;
}